

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_3;
  LocalVariableDeclarationSyntax *pLVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_50,
                      (BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::DeclaratorSyntax>
                     ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)(__fn + 0x68),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LocalVariableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,(DataTypeSyntax *)args_2,args_3,
                      &local_50);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LocalVariableDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LocalVariableDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.var.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}